

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS
ref_cavity_find_face(REF_CAVITY ref_cavity,REF_INT *nodes,REF_INT *found_face,REF_BOOL *reversed)

{
  int local_34;
  REF_INT face;
  REF_BOOL *reversed_local;
  REF_INT *found_face_local;
  REF_INT *nodes_local;
  REF_CAVITY ref_cavity_local;
  
  *found_face = -1;
  local_34 = 0;
  do {
    if (ref_cavity->maxface <= local_34) {
      return 5;
    }
    if (((-1 < local_34) && (local_34 < ref_cavity->maxface)) &&
       (ref_cavity->f2n[local_34 * 3] != -1)) {
      if (((((*nodes == ref_cavity->f2n[local_34 * 3]) &&
            (nodes[1] == ref_cavity->f2n[local_34 * 3 + 1])) &&
           (nodes[2] == ref_cavity->f2n[local_34 * 3 + 2])) ||
          (((nodes[1] == ref_cavity->f2n[local_34 * 3] &&
            (nodes[2] == ref_cavity->f2n[local_34 * 3 + 1])) &&
           (*nodes == ref_cavity->f2n[local_34 * 3 + 2])))) ||
         (((nodes[2] == ref_cavity->f2n[local_34 * 3] &&
           (*nodes == ref_cavity->f2n[local_34 * 3 + 1])) &&
          (nodes[1] == ref_cavity->f2n[local_34 * 3 + 2])))) {
        *found_face = local_34;
        *reversed = 0;
        return 0;
      }
      if ((((nodes[2] == ref_cavity->f2n[local_34 * 3]) &&
           (nodes[1] == ref_cavity->f2n[local_34 * 3 + 1])) &&
          (*nodes == ref_cavity->f2n[local_34 * 3 + 2])) ||
         ((((nodes[1] == ref_cavity->f2n[local_34 * 3] &&
            (*nodes == ref_cavity->f2n[local_34 * 3 + 1])) &&
           (nodes[2] == ref_cavity->f2n[local_34 * 3 + 2])) ||
          (((*nodes == ref_cavity->f2n[local_34 * 3] &&
            (nodes[2] == ref_cavity->f2n[local_34 * 3 + 1])) &&
           (nodes[1] == ref_cavity->f2n[local_34 * 3 + 2])))))) {
        *found_face = local_34;
        *reversed = 1;
        return 0;
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cavity_find_face(REF_CAVITY ref_cavity, REF_INT *nodes,
                                        REF_INT *found_face,
                                        REF_BOOL *reversed) {
  REF_INT face;

  *found_face = REF_EMPTY;

  each_ref_cavity_valid_face(ref_cavity, face) {
    if ((nodes[0] == ref_cavity_f2n(ref_cavity, 0, face) &&
         nodes[1] == ref_cavity_f2n(ref_cavity, 1, face) &&
         nodes[2] == ref_cavity_f2n(ref_cavity, 2, face)) ||
        (nodes[1] == ref_cavity_f2n(ref_cavity, 0, face) &&
         nodes[2] == ref_cavity_f2n(ref_cavity, 1, face) &&
         nodes[0] == ref_cavity_f2n(ref_cavity, 2, face)) ||
        (nodes[2] == ref_cavity_f2n(ref_cavity, 0, face) &&
         nodes[0] == ref_cavity_f2n(ref_cavity, 1, face) &&
         nodes[1] == ref_cavity_f2n(ref_cavity, 2, face))) {
      *found_face = face;
      *reversed = REF_FALSE;
      return REF_SUCCESS;
    }
    if ((nodes[2] == ref_cavity_f2n(ref_cavity, 0, face) &&
         nodes[1] == ref_cavity_f2n(ref_cavity, 1, face) &&
         nodes[0] == ref_cavity_f2n(ref_cavity, 2, face)) ||
        (nodes[1] == ref_cavity_f2n(ref_cavity, 0, face) &&
         nodes[0] == ref_cavity_f2n(ref_cavity, 1, face) &&
         nodes[2] == ref_cavity_f2n(ref_cavity, 2, face)) ||
        (nodes[0] == ref_cavity_f2n(ref_cavity, 0, face) &&
         nodes[2] == ref_cavity_f2n(ref_cavity, 1, face) &&
         nodes[1] == ref_cavity_f2n(ref_cavity, 2, face))) {
      *found_face = face;
      *reversed = REF_TRUE;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}